

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::messageLoop(RpcConnectionState *this)

{
  TransformPromiseNodeBase *pTVar1;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  PromiseNode *pPVar2;
  _func_int **in_RSI;
  Promise<void> PVar3;
  Own<kj::_::PromiseNode> intermediate;
  Own<kj::_::PromiseNode> local_58;
  PromiseFulfillerPair<void> paf;
  Own<kj::_::PromiseNode> local_28;
  
  if (*(int *)(in_RSI + 9) == 1) {
    if (in_RSI[0x144] < in_RSI[0x145]) {
      kj::newPromiseAndFulfiller<void>();
      intermediate.disposer = paf.fulfiller.disposer;
      intermediate.ptr = (PromiseNode *)paf.fulfiller.ptr;
      paf.fulfiller.ptr = (PromiseFulfiller<void> *)0x0;
      kj::Own<kj::PromiseFulfiller<void>_>::operator=
                ((Own<kj::PromiseFulfiller<void>_> *)(in_RSI + 0x146),
                 (Own<kj::PromiseFulfiller<void>_> *)&intermediate);
      kj::Own<kj::PromiseFulfiller<void>_>::dispose
                ((Own<kj::PromiseFulfiller<void>_> *)&intermediate);
      pTVar1 = (TransformPromiseNodeBase *)operator_new(0x30);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar1,(Own<kj::_::PromiseNode> *)&paf,
                 kj::_::
                 TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:2081:31),_kj::_::PropagateException>
                 ::anon_class_8_1_8991fb9c_for_func::operator());
      (pTVar1->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0066f188;
      pTVar1[1].super_PromiseNode._vptr_PromiseNode = in_RSI;
      intermediate.disposer =
           (Disposer *)
           &kj::_::
            HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,capnp::_::(anonymous_namespace)::RpcConnectionState::messageLoop()::{lambda()#1},kj::_::PropagateException>>
            ::instance;
      intermediate.ptr = (PromiseNode *)pTVar1;
      kj::_::maybeChain<void>(&local_28,(Promise<void> *)&intermediate);
      pPVar2 = local_28.ptr;
      local_58.disposer = local_28.disposer;
      local_28.ptr = (PromiseNode *)0x0;
      kj::Own<kj::_::PromiseNode>::dispose(&local_28);
      (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)local_28.disposer;
      (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)pPVar2;
      local_58.ptr = (PromiseNode *)0x0;
      kj::Own<kj::_::PromiseNode>::dispose(&local_58);
      kj::Own<kj::_::PromiseNode>::dispose(&intermediate);
      kj::PromiseFulfillerPair<void>::~PromiseFulfillerPair(&paf);
      pPVar2 = extraout_RDX;
    }
    else {
      (**(code **)(*(long *)in_RSI[0xb] + 8))(&local_28);
      pTVar1 = (TransformPromiseNodeBase *)operator_new(0x30);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar1,&local_28,
                 kj::_::
                 TransformPromiseNode<bool,_kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:2087:9),_kj::_::PropagateException>
                 ::anon_class_8_1_8991fb9c_for_func::operator());
      (pTVar1->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0066f210;
      pTVar1[1].super_PromiseNode._vptr_PromiseNode = in_RSI;
      paf.promise.super_PromiseBase.node.disposer =
           (Disposer *)
           &kj::_::
            HeapDisposer<kj::_::TransformPromiseNode<bool,kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>,capnp::_::(anonymous_namespace)::RpcConnectionState::messageLoop()::{lambda(kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>&&)#1},kj::_::PropagateException>>
            ::instance;
      intermediate.disposer =
           (Disposer *)
           &kj::_::
            HeapDisposer<kj::_::TransformPromiseNode<bool,kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>,capnp::_::(anonymous_namespace)::RpcConnectionState::messageLoop()::{lambda(kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>&&)#1},kj::_::PropagateException>>
            ::instance;
      paf.promise.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      local_58.disposer =
           (Disposer *)
           &kj::_::
            HeapDisposer<kj::_::TransformPromiseNode<bool,kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>,capnp::_::(anonymous_namespace)::RpcConnectionState::messageLoop()::{lambda(kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>&&)#1},kj::_::PropagateException>>
            ::instance;
      intermediate.ptr = (PromiseNode *)0x0;
      local_58.ptr = (PromiseNode *)pTVar1;
      kj::Own<kj::_::PromiseNode>::dispose(&intermediate);
      kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&paf);
      pTVar1 = (TransformPromiseNodeBase *)operator_new(0x30);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar1,&local_58,
                 kj::_::
                 TransformPromiseNode<kj::_::Void,_bool,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:2095:13),_kj::_::PropagateException>
                 ::anon_class_8_1_8991fb9c_for_func::operator());
      (pTVar1->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00670d00;
      pTVar1[1].super_PromiseNode._vptr_PromiseNode = in_RSI;
      paf.promise.super_PromiseBase.node.disposer =
           (Disposer *)
           &kj::_::
            HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,bool,capnp::_::(anonymous_namespace)::RpcConnectionState::messageLoop()::{lambda(bool)#1},kj::_::PropagateException>>
            ::instance;
      intermediate.disposer =
           (Disposer *)
           &kj::_::
            HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,bool,capnp::_::(anonymous_namespace)::RpcConnectionState::messageLoop()::{lambda(bool)#1},kj::_::PropagateException>>
            ::instance;
      paf.promise.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (this->super_ErrorHandler)._vptr_ErrorHandler =
           (_func_int **)
           &kj::_::
            HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,bool,capnp::_::(anonymous_namespace)::RpcConnectionState::messageLoop()::{lambda(bool)#1},kj::_::PropagateException>>
            ::instance;
      (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)pTVar1;
      intermediate.ptr = (PromiseNode *)0x0;
      kj::Own<kj::_::PromiseNode>::dispose(&intermediate);
      kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&paf);
      kj::Own<kj::_::PromiseNode>::dispose(&local_58);
      kj::Own<kj::_::PromiseNode>::dispose(&local_28);
      pPVar2 = extraout_RDX_01;
    }
  }
  else {
    kj::Promise<void>::Promise((Promise<void> *)this);
    pPVar2 = extraout_RDX_00;
  }
  PVar3.super_PromiseBase.node.ptr = pPVar2;
  PVar3.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar3.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> messageLoop() {
    if (!connection.is<Connected>()) {
      return kj::READY_NOW;
    }

    if (callWordsInFlight > flowLimit) {
      auto paf = kj::newPromiseAndFulfiller<void>();
      flowWaiter = kj::mv(paf.fulfiller);
      return paf.promise.then([this]() {
        return messageLoop();
      });
    }

    return connection.get<Connected>()->receiveIncomingMessage().then(
        [this](kj::Maybe<kj::Own<IncomingRpcMessage>>&& message) {
      KJ_IF_MAYBE(m, message) {
        handleMessage(kj::mv(*m));
        return true;
      } else {
        disconnect(KJ_EXCEPTION(DISCONNECTED, "Peer disconnected."));
        return false;
      }
    }).then([this](bool keepGoing) {
      // No exceptions; continue loop.
      //
      // (We do this in a separate continuation to handle the case where exceptions are
      // disabled.)
      if (keepGoing) tasks.add(messageLoop());
    });
  }